

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-process-priority.c
# Opt level: O2

int run_test_process_priority(void)

{
  int iVar1;
  uv_pid_t pid;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uVar5;
  int64_t eval_b;
  int64_t eval_a;
  int r;
  int priority;
  
  r = uv_os_getpriority(0,(int *)0x0);
  eval_a = (int64_t)r;
  eval_b = -0x16;
  if (eval_a == -0x16) {
    for (lVar2 = -0x14; lVar2 != 0x14; lVar2 = lVar2 + 1) {
      r = uv_os_setpriority(0,(int)lVar2);
      if (r != -0xd) {
        eval_a = (int64_t)r;
        eval_b = 0;
        if (eval_a != 0) {
          pcVar4 = "0";
          pcVar3 = "r";
          uVar5 = 0x31;
          goto LAB_00165ac0;
        }
        iVar1 = uv_os_getpriority(0,&priority);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a != 0) {
          pcVar4 = "0";
          pcVar3 = "uv_os_getpriority(0, &priority)";
          uVar5 = 0x32;
          goto LAB_00165ac0;
        }
        eval_a = (int64_t)priority;
        if (eval_a != lVar2) {
          pcVar4 = "i";
          pcVar3 = "priority";
          uVar5 = 0x37;
          eval_b = lVar2;
          goto LAB_00165ac0;
        }
        pid = uv_os_getpid();
        iVar1 = uv_os_getpriority(pid,&r);
        eval_a = (int64_t)iVar1;
        eval_b = 0;
        if (eval_a != 0) {
          pcVar4 = "0";
          pcVar3 = "uv_os_getpriority(uv_os_getpid(), &r)";
          uVar5 = 0x4a;
          goto LAB_00165ac0;
        }
        eval_a = (int64_t)priority;
        if (eval_a != r) {
          pcVar4 = "r";
          pcVar3 = "priority";
          uVar5 = 0x4b;
          eval_b = (long)r;
          goto LAB_00165ac0;
        }
      }
    }
    iVar1 = uv_os_setpriority(0,-0x15);
    eval_a = (int64_t)iVar1;
    eval_b = -0x16;
    if (eval_a == -0x16) {
      iVar1 = uv_os_setpriority(0,0x14);
      eval_a = (int64_t)iVar1;
      eval_b = -0x16;
      if (eval_a == -0x16) {
        return 0;
      }
      pcVar4 = "UV_EINVAL";
      pcVar3 = "uv_os_setpriority(0, 19 + 1)";
      uVar5 = 0x50;
    }
    else {
      pcVar4 = "UV_EINVAL";
      pcVar3 = "uv_os_setpriority(0, -20 - 1)";
      uVar5 = 0x4f;
    }
  }
  else {
    pcVar4 = "UV_EINVAL";
    pcVar3 = "r";
    uVar5 = 0x26;
  }
LAB_00165ac0:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-process-priority.c"
          ,uVar5,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(process_priority) {
  int priority;
  int r;
  int i;

#if defined(__MVS__)
  if (uv_os_setpriority(0, 0) == UV_ENOSYS)
    RETURN_SKIP("functionality not supported on zOS");
#endif

  /* Verify that passing a NULL pointer returns UV_EINVAL. */
  r = uv_os_getpriority(0, NULL);
  ASSERT_EQ(r, UV_EINVAL);

  /* Verify that all valid values work. */
  for (i = UV_PRIORITY_HIGHEST; i <= UV_PRIORITY_LOW; i++) {
    r = uv_os_setpriority(0, i);

    /* If UV_EACCES is returned, the current user doesn't have permission to
       set this specific priority. */
    if (r == UV_EACCES)
      continue;

    ASSERT_OK(r);
    ASSERT_OK(uv_os_getpriority(0, &priority));

    /* Verify that the priority values match on Unix, and are range mapped
       on Windows. */
#ifndef _WIN32
    ASSERT_EQ(priority, i);
#else
    /* On Windows, only elevated users can set UV_PRIORITY_HIGHEST. Other
       users will silently be set to UV_PRIORITY_HIGH. */
    if (i < UV_PRIORITY_HIGH)
      ASSERT(priority == UV_PRIORITY_HIGHEST || priority == UV_PRIORITY_HIGH);
    else if (i < UV_PRIORITY_ABOVE_NORMAL)
      ASSERT_EQ(priority, UV_PRIORITY_HIGH);
    else if (i < UV_PRIORITY_NORMAL)
      ASSERT_EQ(priority, UV_PRIORITY_ABOVE_NORMAL);
    else if (i < UV_PRIORITY_BELOW_NORMAL)
      ASSERT_EQ(priority, UV_PRIORITY_NORMAL);
    else if (i < UV_PRIORITY_LOW)
      ASSERT_EQ(priority, UV_PRIORITY_BELOW_NORMAL);
    else
      ASSERT_EQ(priority, UV_PRIORITY_LOW);
#endif

    /* Verify that the current PID and 0 are equivalent. */
    ASSERT_OK(uv_os_getpriority(uv_os_getpid(), &r));
    ASSERT_EQ(priority, r);
  }

  /* Verify that invalid priorities return UV_EINVAL. */
  ASSERT_EQ(uv_os_setpriority(0, UV_PRIORITY_HIGHEST - 1), UV_EINVAL);
  ASSERT_EQ(uv_os_setpriority(0, UV_PRIORITY_LOW + 1), UV_EINVAL);

  return 0;
}